

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetMetricQueryPoolDestroyPrologue
          (ZETHandleLifetimeValidation *this,zet_metric_query_pool_handle_t hMetricQueryPool)

{
  undefined8 *puVar1;
  long lVar2;
  bool bVar3;
  zet_metric_query_pool_handle_t local_28;
  
  lVar2 = context;
  if ((hMetricQueryPool == (zet_metric_query_pool_handle_t)0x0) ||
     (bVar3 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(context + 0xd48),hMetricQueryPool), !bVar3))
  {
    bVar3 = HandleLifetimeValidation::isHandleValid
                      (*(HandleLifetimeValidation **)(context + 0xd48),hMetricQueryPool);
    if (!bVar3) {
      return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    }
  }
  else {
    bVar3 = HandleLifetimeValidation::hasDependents
                      (*(HandleLifetimeValidation **)(lVar2 + 0xd48),hMetricQueryPool);
    if (bVar3) {
      return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
    }
    local_28 = hMetricQueryPool;
    for (puVar1 = *(undefined8 **)(*(long *)(lVar2 + 0xd48) + 0xbf8); puVar1 != (undefined8 *)0x0;
        puVar1 = (undefined8 *)*puVar1) {
      std::
      _Hashtable<const_void_*,_const_void_*,_std::allocator<const_void_*>,_std::__detail::_Identity,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<const_void_*,_const_void_*,_std::allocator<const_void_*>,_std::__detail::_Identity,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(puVar1 + 2),&local_28);
    }
    local_28 = hMetricQueryPool;
    std::
    _Hashtable<_zet_metric_query_pool_handle_t_*,_std::pair<_zet_metric_query_pool_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_zet_metric_query_pool_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_zet_metric_query_pool_handle_t_*>,_std::hash<_zet_metric_query_pool_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<_zet_metric_query_pool_handle_t_*,_std::pair<_zet_metric_query_pool_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_zet_metric_query_pool_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_zet_metric_query_pool_handle_t_*>,_std::hash<_zet_metric_query_pool_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(*(long *)(lVar2 + 0xd48) + 0x6a8));
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetMetricQueryPoolDestroyPrologue(
        zet_metric_query_pool_handle_t hMetricQueryPool ///< [in][release] handle of the metric query pool
        )
    { 
        
        if (hMetricQueryPool && context.handleLifetime->isHandleValid( hMetricQueryPool )){
            if (context.handleLifetime->hasDependents( hMetricQueryPool )){
                return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
            }
            context.handleLifetime->removeDependent( hMetricQueryPool);
            context.handleLifetime->removeHandle( hMetricQueryPool );
        } else if (!context.handleLifetime->isHandleValid( hMetricQueryPool )) {
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }